

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtIntersect(word *pIn1,word *pIn2,int nWords,int fCompl)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  if (0 < nWords) {
    uVar4 = (ulong)(uint)nWords;
  }
  if (fCompl == 0) {
    uVar3 = 0;
    do {
      if (uVar4 == uVar3) {
        return 0;
      }
      puVar1 = pIn2 + uVar3;
      puVar2 = pIn1 + uVar3;
      uVar3 = uVar3 + 1;
    } while ((*puVar2 & *puVar1) == 0);
  }
  else {
    uVar3 = 0;
    do {
      if (uVar4 == uVar3) {
        return 0;
      }
      puVar1 = pIn1 + uVar3;
      puVar2 = pIn2 + uVar3;
      uVar3 = uVar3 + 1;
    } while ((*puVar2 & ~*puVar1) == 0);
  }
  return 1;
}

Assistant:

static inline int Abc_TtIntersect( word * pIn1, word * pIn2, int nWords, int fCompl )
{
    int w;
    if ( fCompl )
    {
        for ( w = 0; w < nWords; w++ )
            if ( ~pIn1[w] & pIn2[w] )
                return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( pIn1[w] & pIn2[w] )
                return 1;
    }
    return 0;
}